

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O1

void test_bson_json_number_long_zero(void)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long lVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *__needle;
  void *pvVar9;
  void *pvVar10;
  char *pcVar11;
  void *pvVar12;
  undefined1 *__n;
  undefined1 *__s1;
  undefined1 *puVar13;
  void *__s2;
  undefined1 *puVar14;
  int *piVar15;
  double *pdVar16;
  long *plVar17;
  undefined8 extraout_RAX;
  undefined8 uVar18;
  undefined8 uVar19;
  ulong uVar20;
  int *piVar21;
  ulong uVar22;
  char *pcVar23;
  ulong uVar24;
  char *pcVar25;
  long lVar26;
  undefined **ppuVar27;
  undefined **ppuVar28;
  int *piVar29;
  double dVar30;
  int extraout_XMM0_Db;
  bson_iter_t iter;
  bson_t b;
  bson_error_t error;
  code **ppcVar31;
  undefined4 uStack_45dc;
  undefined8 uStack_45d8;
  undefined2 uStack_45d0;
  int iStack_45c8;
  int iStack_45c4;
  char acStack_45c0 [504];
  code *pcStack_43c8;
  undefined1 auStack_43b8 [512];
  char *pcStack_41b8;
  code *pcStack_41b0;
  int iStack_41a0;
  int iStack_419c;
  char acStack_4198 [504];
  long *plStack_3fa0;
  double *pdStack_3f98;
  char *pcStack_3f90;
  code *pcStack_3f88;
  long lStack_3f10;
  long lStack_3f08;
  undefined1 auStack_3f00 [128];
  undefined1 auStack_3e80 [232];
  undefined1 auStack_3d98 [608];
  long *plStack_3b38;
  code *pcStack_3b30;
  undefined1 auStack_3b28 [8];
  char acStack_3b20 [16];
  char *pcStack_3b10;
  code *pcStack_3b08;
  uint uStack_3a84;
  undefined8 uStack_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 uStack_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 uStack_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 uStack_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined1 auStack_39b8 [648];
  int *piStack_3730;
  double *pdStack_3728;
  undefined **ppuStack_3720;
  int *piStack_3718;
  int *piStack_3710;
  code *pcStack_3708;
  undefined1 auStack_3700 [240];
  undefined1 auStack_3610 [648];
  code *apcStack_3388 [16];
  double dStack_3308;
  int aiStack_3300 [50];
  int iStack_3238;
  int iStack_3234;
  int aiStack_3230 [160];
  int *piStack_2fb0;
  double *pdStack_2fa8;
  undefined **ppuStack_2fa0;
  int *piStack_2f98;
  int *piStack_2f90;
  code *apcStack_2f88 [16];
  double dStack_2f08;
  int aiStack_2f00 [50];
  int iStack_2e38;
  int iStack_2e34;
  int aiStack_2e30 [160];
  undefined8 uStack_2bb0;
  undefined1 *puStack_2ba8;
  char *pcStack_2ba0;
  char *pcStack_2b98;
  undefined **ppuStack_2b90;
  code *pcStack_2b88;
  int iStack_2b80;
  int iStack_2b7c;
  char acStack_2b78 [504];
  undefined1 auStack_2980 [336];
  char *pcStack_2830;
  undefined1 *puStack_2828;
  undefined1 *puStack_2820;
  void *pvStack_2818;
  void *pvStack_2810;
  code *pcStack_2808;
  undefined1 auStack_2800 [128];
  char acStack_2780 [232];
  undefined1 auStack_2698 [648];
  char *pcStack_2410;
  code *pcStack_2408;
  undefined1 auStack_2400 [128];
  char acStack_2380 [224];
  int iStack_22a0;
  int iStack_229c;
  char acStack_2298 [640];
  char *pcStack_2018;
  void *pvStack_2010;
  code *pcStack_2008;
  undefined1 auStack_2000 [128];
  char acStack_1f80 [232];
  undefined1 auStack_1e98 [648];
  char *pcStack_1c10;
  code *pcStack_1c08;
  undefined1 auStack_1c00 [232];
  int iStack_1b18;
  int iStack_1b14;
  char acStack_1b10 [640];
  char *pcStack_1890;
  code *apcStack_1888 [16];
  uint uStack_1804;
  undefined1 auStack_1800 [4];
  uint uStack_17fc;
  undefined1 auStack_1738 [648];
  undefined1 *puStack_14b0;
  undefined1 *puStack_14a8;
  undefined1 *puStack_14a0;
  void *pvStack_1498;
  void *pvStack_1490;
  code *apcStack_1488 [2];
  void *pvStack_1478;
  char *pcStack_1470;
  void *pvStack_1468;
  char *pcStack_1460;
  void *pvStack_1458;
  char *pcStack_1450;
  undefined1 *puStack_1448;
  char *pcStack_1440;
  undefined1 *puStack_1438;
  char *pcStack_1430;
  undefined8 uStack_1428;
  char *pcStack_1420;
  undefined8 uStack_1418;
  char *pcStack_1410;
  undefined8 uStack_1408;
  undefined1 auStack_1400 [4];
  uint uStack_13fc;
  undefined1 auStack_1338 [592];
  undefined8 uStack_10e8;
  char *pcStack_10e0;
  char *pcStack_10d8;
  char *pcStack_10d0;
  char *pcStack_10c8;
  char *pcStack_10c0;
  char *pcStack_10b8;
  char *pcStack_10b0;
  char *pcStack_10a8;
  char *pcStack_10a0;
  char *pcStack_1098;
  char *pcStack_1090;
  code *apcStack_1088 [7];
  void *pvStack_1050;
  undefined8 uStack_1048;
  char *pcStack_1040;
  void *pvStack_1038;
  char *pcStack_1030;
  undefined8 uStack_1028;
  char *pcStack_1020;
  void *pvStack_1018;
  char *pcStack_1010;
  undefined8 uStack_1008;
  char acStack_1000 [4];
  uint uStack_ffc;
  undefined1 auStack_f38 [648];
  undefined **ppuStack_cb0;
  char *pcStack_ca8;
  long lStack_ca0;
  undefined1 *puStack_c98;
  undefined1 *puStack_c90;
  code *pcStack_c88;
  int iStack_c80;
  int iStack_c7c;
  char acStack_c78 [504];
  undefined1 auStack_a80 [168];
  undefined8 uStack_9d8;
  long lStack_9d0;
  undefined8 uStack_9c8;
  undefined8 uStack_9c0;
  char *pcStack_9b8;
  char *pcStack_9b0;
  char *pcStack_9a8;
  char *pcStack_9a0;
  char *pcStack_998;
  long lStack_990;
  undefined8 uStack_988;
  char *pcStack_980;
  char *pcStack_978;
  char *pcStack_970;
  char *pcStack_968;
  long lStack_960;
  char *pcStack_958;
  char *pcStack_950;
  char *pcStack_948;
  char *pcStack_940;
  char *pcStack_938;
  char *pcStack_930;
  char *pcStack_928;
  char *pcStack_920;
  char *pcStack_918;
  char *pcStack_910;
  code *apcStack_908 [12];
  char *pcStack_8a8;
  undefined8 uStack_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 uStack_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 uStack_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 uStack_840;
  undefined8 uStack_838;
  char *apcStack_830 [22];
  char acStack_780 [4];
  uint uStack_77c;
  undefined1 auStack_6b8 [648];
  code *pcStack_408;
  undefined1 auStack_400 [128];
  undefined1 local_380 [240];
  undefined1 local_290 [648];
  
  pcStack_408 = (code *)0x130d27;
  cVar1 = bson_init_from_json(local_380,"{ \"key\": { \"$numberLong\": \"0\" }}",0xffffffffffffffff,
                              local_290);
  if (cVar1 != '\0') {
    pcStack_408 = (code *)0x130d3b;
    cVar1 = bson_iter_init(auStack_400,local_380);
    if (cVar1 == '\0') {
      pcStack_408 = (code *)0x130d83;
      test_bson_json_number_long_zero_cold_2();
LAB_00130d83:
      pcStack_408 = (code *)0x130d88;
      test_bson_json_number_long_zero_cold_3();
LAB_00130d88:
      pcStack_408 = (code *)0x130d8d;
      test_bson_json_number_long_zero_cold_4();
    }
    else {
      pcStack_408 = (code *)0x130d4e;
      cVar1 = bson_iter_find(auStack_400,"key");
      if (cVar1 == '\0') goto LAB_00130d83;
      pcStack_408 = (code *)0x130d5a;
      iVar2 = bson_iter_type(auStack_400);
      if (iVar2 != 0x12) goto LAB_00130d88;
      pcStack_408 = (code *)0x130d67;
      lVar5 = bson_iter_int64(auStack_400);
      if (lVar5 == 0) {
        pcStack_408 = (code *)0x130d79;
        bson_destroy(local_380);
        return;
      }
    }
    pcStack_408 = (code *)0x130d92;
    test_bson_json_number_long_zero_cold_5();
  }
  pcStack_408 = test_bson_json_code;
  test_bson_json_number_long_zero_cold_1();
  apcStack_908[0] = (code *)0x130dbc;
  pcStack_408 = (code *)&stack0xfffffffffffffff8;
  lVar5 = bson_bcon_magic();
  apcStack_908[0] = (code *)0x130de7;
  pcStack_8a8 = (char *)bcon_new(0,"a",lVar5,0xc,"b",0);
  apcStack_908[0] = (code *)0x130e0a;
  uStack_838 = bcon_new(0,"a",lVar5,0xc,"b",0);
  apcStack_908[0] = (code *)0x130e33;
  uVar6 = bcon_new(0,"var",lVar5,0xf,1,0);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x130e59;
  uStack_840 = bcon_new(0,"a",lVar5,0xe,"b",uVar6);
  apcStack_908[0] = (code *)0x130e86;
  uVar7 = bcon_new(0,"var2",lVar5,0x11,2,0);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x130eac;
  uStack_848 = bcon_new(0,"a",lVar5,0xe,"b",uVar7);
  apcStack_908[0] = (code *)0x0;
  pcStack_918 = "d";
  pcStack_920 = (char *)0xe;
  pcStack_930 = "c";
  pcStack_938 = (char *)0x130ef6;
  pcStack_928 = (char *)lVar5;
  pcStack_910 = (char *)uVar7;
  uStack_880 = uVar7;
  uStack_850 = bcon_new(0,"a",lVar5,0xe,"b",uVar6);
  pcStack_910 = (char *)0x0;
  pcStack_918 = "}";
  pcStack_920 = "}";
  pcStack_928 = "value2";
  pcStack_930 = (char *)0x0;
  pcStack_940 = "key2";
  pcStack_948 = "{";
  pcStack_950 = "subdoc";
  pcStack_958 = "value";
  lStack_960 = 0;
  pcStack_970 = "key1";
  pcStack_978 = "{";
  pcStack_980 = "c";
  uStack_988 = 0x130f7a;
  pcStack_968 = (char *)lVar5;
  pcStack_938 = (char *)lVar5;
  uStack_858 = bcon_new(0,"a",lVar5,0xe,"b",uVar6);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x130fbe;
  uStack_878 = uVar6;
  uStack_860 = bcon_new(0,"a",lVar5,0xe,"b",uVar6);
  apcStack_908[0] = (code *)0x130fe7;
  uStack_888 = bcon_new(0,"var","{","}",0);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x13100f;
  uStack_868 = bcon_new(0,"a",lVar5,0xe,"b",uStack_888);
  apcStack_908[0] = (code *)0x0;
  pcStack_910 = "}";
  pcStack_918 = "}";
  pcStack_920 = (char *)0x3;
  pcStack_928 = (char *)0xf;
  pcStack_938 = "z";
  pcStack_940 = "{";
  pcStack_948 = "d3";
  pcStack_950 = (char *)0x1;
  pcStack_958 = (char *)0xf;
  pcStack_968 = "x";
  pcStack_970 = "{";
  pcStack_978 = "d2";
  pcStack_980 = (char *)0x1;
  uStack_988 = 0x11;
  pcStack_998 = "n";
  pcStack_9a0 = "}";
  pcStack_9a8 = "{";
  pcStack_9b0 = "d";
  pcStack_9b8 = "]";
  uStack_9c0 = 2;
  uStack_9c8 = 0xf;
  uStack_9d8 = 0x1310bd;
  lStack_9d0 = lVar5;
  lStack_990 = lVar5;
  lStack_960 = lVar5;
  pcStack_930 = (char *)lVar5;
  uStack_890 = bcon_new(0,"arr","[",lVar5,0xf,1);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x1310f6;
  uStack_870 = bcon_new(0,"a",lVar5,0xe,"b",uStack_890);
  apcStack_908[0] = (code *)0x131107;
  uStack_898 = bson_new();
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x13112f;
  pcVar8 = (char *)bcon_new(0,"a",lVar5,0xe,"b",uStack_898);
  pcStack_910 = (char *)0x0;
  pcStack_918 = "}";
  pcStack_920 = "c";
  pcStack_928 = (char *)0x131172;
  uStack_8a0 = bcon_new(0,"x","{","$code",lVar5,0);
  pcStack_910 = (char *)0x0;
  pcStack_918 = (char *)0x131197;
  apcStack_830[0x15] = (char *)bcon_new(0,"a",lVar5,0xe,"b",uStack_8a0);
  apcStack_830[0] = "{\"a\": {\"$code\": \"b\"}}";
  apcStack_830[1] = pcStack_8a8;
  apcStack_830[2] = "{\"a\": {\"$code\": \"b\\u0000c\\u0000\"}}";
  apcStack_830[3] = (char *)uStack_838;
  apcStack_830[4] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}}";
  apcStack_830[5] = (char *)uStack_840;
  apcStack_830[6] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}";
  apcStack_830[7] = (char *)uStack_848;
  apcStack_830[8] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"key1\": \"value\",          \"subdoc\": {\"key2\": \"value2\"}}}"
  ;
  apcStack_830[9] = (char *)uStack_858;
  apcStack_830[10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": 1}}, \"c\": {\"$code\": \"d\",          \"$scope\": {\"var2\": {\"$numberLong\": \"2\"}}}}"
  ;
  apcStack_830[0xb] = (char *)uStack_850;
  apcStack_830[0xc] = "{\"a\": {\"$scope\": {\"var\": 1},          \"$code\": \"b\"}}";
  apcStack_830[0xd] = (char *)uStack_860;
  apcStack_830[0xe] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"var\": {}}}}";
  apcStack_830[0xf] = (char *)uStack_868;
  apcStack_830[0x10] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"arr\": [1, 2], \"d\": {},                      \"n\": {\"$numberLong\": \"1\"},                      \"d2\": {\"x\": 1, \"d3\": {\"z\": 3}}}}}"
  ;
  apcStack_830[0x11] = (char *)uStack_870;
  apcStack_830[0x12] = "{\"a\": {\"$code\": \"b\",          \"$scope\": {}}}";
  apcStack_830[0x13] = pcVar8;
  apcStack_830[0x14] =
       "{\"a\": {\"$code\": \"b\",          \"$scope\": {\"x\": {\"$code\": \"c\"}}}}";
  pcVar25 = (char *)0x8;
  pcVar11 = acStack_780;
  pcVar23 = "b";
  while( true ) {
    apcStack_908[0] = (code *)0x13130a;
    cVar1 = bson_init_from_json(pcVar11,*(undefined8 *)((long)&uStack_838 + (long)pcVar25),
                                0xffffffffffffffff,auStack_6b8);
    __needle = pcVar25;
    if (cVar1 == '\0') break;
    apcStack_908[0] = (code *)0x13131d;
    pcStack_8a8 = (char *)bson_get_data(pcVar11);
    lVar5 = *(long *)((long)apcStack_830 + (long)pcVar25);
    apcStack_908[0] = (code *)0x131332;
    __needle = (char *)bson_get_data(lVar5);
    if (*(uint *)(lVar5 + 4) != uStack_77c) {
LAB_001313fc:
      apcStack_908[0] = (code *)0x13140e;
      pcVar11 = (char *)bson_as_canonical_extended_json(acStack_780);
      apcStack_908[0] = (code *)0x13141b;
      uVar6 = bson_as_canonical_extended_json(lVar5);
      pcVar8 = pcStack_8a8;
      uVar20 = 0xffffffff;
      if (uStack_77c == 0) goto LAB_00131463;
      uVar22 = 0;
      goto LAB_00131448;
    }
    apcStack_908[0] = (code *)0x13134e;
    pvVar9 = (void *)bson_get_data(lVar5);
    apcStack_908[0] = (code *)0x131359;
    pvVar10 = (void *)bson_get_data(pcVar11);
    apcStack_908[0] = (code *)0x131368;
    iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(lVar5 + 4));
    if (iVar2 != 0) goto LAB_001313fc;
    apcStack_908[0] = (code *)0x13137b;
    bson_destroy(pcVar11);
    pcVar25 = pcVar25 + 0x10;
    pcVar23 = pcVar11;
    pcVar8 = __needle;
    if (pcVar25 == (char *)0xb8) {
      lVar5 = 8;
      do {
        apcStack_908[0] = (code *)0x13139e;
        bson_destroy(*(undefined8 *)((long)apcStack_830 + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0xb8);
      apcStack_908[0] = (code *)0x1313b8;
      bson_destroy(uStack_878);
      apcStack_908[0] = (code *)0x1313c5;
      bson_destroy(uStack_880);
      apcStack_908[0] = (code *)0x1313cf;
      bson_destroy(uStack_888);
      apcStack_908[0] = (code *)0x1313d9;
      bson_destroy(uStack_890);
      apcStack_908[0] = (code *)0x1313e3;
      bson_destroy(uStack_8a0);
      apcStack_908[0] = (code *)0x1313ed;
      bson_destroy(uStack_898);
      return;
    }
  }
  goto LAB_00131529;
  while( true ) {
    if (pcStack_8a8[uVar22] != __needle[uVar22]) {
      uVar20 = uVar22 & 0xffffffff;
      break;
    }
    uVar22 = uVar22 + 1;
    if (uStack_77c == (uint)uVar22) break;
LAB_00131448:
    if (*(int *)(lVar5 + 4) == (int)uVar22) break;
  }
LAB_00131463:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_77c;
    if (uStack_77c < *(uint *)(lVar5 + 4)) {
      uVar3 = *(uint *)(lVar5 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_908[0] = (code *)0x131494;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar11,uVar6);
  apcStack_908[0] = (code *)0x1314ac;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar23 = (char *)(ulong)uVar3;
  apcStack_908[0] = (code *)0x1314c6;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pcStack_8a8 = (char *)CONCAT44(pcStack_8a8._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131515:
    apcStack_908[0] = (code *)0x13151a;
    test_bson_json_code_cold_6();
LAB_0013151a:
    apcStack_908[0] = (code *)0x13151f;
    test_bson_json_code_cold_5();
LAB_0013151f:
    apcStack_908[0] = (code *)0x131524;
    test_bson_json_code_cold_2();
  }
  else {
    pcVar11 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_0013151a;
    pcVar23 = (char *)(ulong)uStack_77c;
    apcStack_908[0] = (code *)0x1314ed;
    pcVar25 = (char *)write(uVar3,pcVar8,(size_t)pcVar23);
    if (pcVar25 != pcVar23) goto LAB_0013151f;
    pcVar23 = (char *)(ulong)*(uint *)(lVar5 + 4);
    apcStack_908[0] = (code *)0x131504;
    pcVar25 = (char *)write(uVar4,__needle,(size_t)pcVar23);
    if (pcVar25 == pcVar23) {
      apcStack_908[0] = (code *)0x131515;
      test_bson_json_code_cold_4();
      goto LAB_00131515;
    }
  }
  apcStack_908[0] = (code *)0x131529;
  test_bson_json_code_cold_3();
LAB_00131529:
  apcStack_908[0] = test_bson_json_code_errors;
  test_bson_json_code_cold_1();
  lVar26 = 8;
  pcStack_930 = pcVar23;
  pcStack_928 = __needle;
  pcStack_920 = pcVar8;
  pcStack_918 = pcVar11;
  pcStack_910 = (char *)lVar5;
  apcStack_908[0] = (code *)&pcStack_408;
  do {
    pcStack_c88 = (code *)0x13157d;
    cVar1 = bson_init_from_json(auStack_a80,*(undefined8 *)(&UNK_00161268 + lVar26),
                                0xffffffffffffffff,&iStack_c80);
    if (cVar1 != '\0') {
      pcStack_c88 = (code *)0x1315ca;
      test_bson_json_code_errors_cold_3();
LAB_001315ca:
      pcStack_c88 = (code *)0x1315cf;
      test_bson_json_code_errors_cold_2();
LAB_001315cf:
      pcStack_c88 = (code *)0x1315ef;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_c78,
              __needle);
      pcStack_c88 = (code *)0x1315f4;
      abort();
    }
    if (iStack_c80 != 1) {
      pcStack_c88 = test_bson_json_dbref;
      test_bson_json_code_errors_cold_1();
      ppuStack_cb0 = &PTR_anon_var_dwarf_1ab4d_00161270;
      apcStack_1088[0] = (code *)0x131616;
      pcStack_ca8 = __needle;
      lStack_ca0 = lVar26;
      puStack_c98 = auStack_a80;
      puStack_c90 = (undefined1 *)&iStack_c80;
      pcStack_c88 = (code *)apcStack_908;
      uVar6 = bson_bcon_magic();
      if (oid_zero_initialized == '\0') {
        apcStack_1088[0] = (code *)0x131635;
        bson_oid_init_from_string(oid_zero_oid,"000000000000000000000000");
        oid_zero_initialized = '\x01';
      }
      pvVar10 = (void *)0x0;
      pcVar8 = "$ref";
      pcStack_1090 = (char *)0x0;
      pcStack_1098 = "}";
      pcStack_10a0 = oid_zero_oid;
      pcStack_10a8 = (char *)0x6;
      pcStack_10b8 = "$id";
      pcStack_10c0 = "collection";
      pcStack_10c8 = (char *)0x131696;
      pcStack_10b0 = (char *)uVar6;
      pvStack_1050 = (void *)bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_1090 = (char *)0x0;
      pcStack_1098 = "}";
      pcStack_10a0 = (char *)0x1;
      pcStack_10a8 = (char *)0xf;
      pcStack_10b8 = "$id";
      pcStack_10c0 = "collection";
      pcStack_10c8 = (char *)0x1316e6;
      pcStack_10b0 = (char *)uVar6;
      uStack_1048 = bcon_new(0,"key","{","$ref",uVar6,0);
      apcStack_1088[0] = (code *)0x0;
      pcStack_1090 = "}";
      pcStack_1098 = "}";
      pcStack_10a0 = (char *)0x1;
      pcStack_10a8 = (char *)0xf;
      pcStack_10b8 = "a";
      pcStack_10c0 = "{";
      pcStack_10c8 = "$id";
      pcStack_10d0 = "collection";
      pcStack_10d8 = (char *)0x13173e;
      pcStack_10b0 = (char *)uVar6;
      pvVar9 = (void *)bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_1090 = (char *)0x0;
      pcStack_1098 = "}";
      pcStack_10a0 = (char *)0x1;
      pcStack_10a8 = (char *)0x7;
      pcStack_10b8 = "meta";
      pcStack_10c0 = (char *)0x1;
      pcStack_10c8 = (char *)0xf;
      pcStack_10d8 = "$id";
      pcStack_10e0 = "collection";
      uStack_10e8 = 0x1317a1;
      pcStack_10d0 = (char *)uVar6;
      pcStack_10b0 = (char *)uVar6;
      uStack_1008 = bcon_new(0,"key","{","$ref",uVar6,0);
      pcStack_1040 = 
      "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"$oid\": \"000000000000000000000000\"}}}";
      pvStack_1038 = pvStack_1050;
      pcStack_1030 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1}}";
      uStack_1028 = uStack_1048;
      pcStack_1020 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": {\"a\": 1}}}";
      pvStack_1018 = pvVar9;
      pcStack_1010 = "{ \"key\": {\"$ref\": \"collection\",\"$id\": 1,\"meta\": true}}";
      pcVar11 = "key";
      break;
    }
    if (iStack_c7c != 2) goto LAB_001315ca;
    __needle = *(char **)((long)&PTR_anon_var_dwarf_1ab4d_00161270 + lVar26);
    pcStack_c88 = (code *)0x1315a4;
    pcVar11 = strstr(acStack_c78,__needle);
    if (pcVar11 == (char *)0x0) goto LAB_001315cf;
    lVar26 = lVar26 + 0x10;
    if (lVar26 == 0x98) {
      return;
    }
  } while( true );
LAB_001317fb:
  apcStack_1088[0] = (code *)0x131817;
  cVar1 = bson_init_from_json(acStack_1000,*(undefined8 *)((long)&pcStack_1040 + (long)pvVar10),
                              0xffffffffffffffff,auStack_f38);
  pcVar23 = acStack_1000;
  pvVar12 = pvVar10;
  if (cVar1 == '\0') goto LAB_001319dd;
  apcStack_1088[0] = (code *)0x13182a;
  pvStack_1050 = (void *)bson_get_data(acStack_1000);
  pcVar23 = *(char **)((long)&pvStack_1038 + (long)pvVar10);
  apcStack_1088[0] = (code *)0x13183c;
  pvVar12 = (void *)bson_get_data(pcVar23);
  if (*(uint *)(pcVar23 + 4) != uStack_ffc) {
LAB_001318b1:
    apcStack_1088[0] = (code *)0x1318c3;
    pcVar8 = (char *)bson_as_canonical_extended_json(acStack_1000);
    apcStack_1088[0] = (code *)0x1318d0;
    uVar6 = bson_as_canonical_extended_json(pcVar23);
    pvVar9 = pvStack_1050;
    uVar20 = 0xffffffff;
    if (uStack_ffc == 0) goto LAB_00131915;
    uVar22 = 0;
    goto LAB_001318fb;
  }
  apcStack_1088[0] = (code *)0x131853;
  pcVar8 = (char *)bson_get_data(pcVar23);
  apcStack_1088[0] = (code *)0x13185e;
  pvVar9 = (void *)bson_get_data(acStack_1000);
  apcStack_1088[0] = (code *)0x13186c;
  iVar2 = bcmp(pcVar8,pvVar9,(ulong)*(uint *)(pcVar23 + 4));
  if (iVar2 != 0) goto LAB_001318b1;
  apcStack_1088[0] = (code *)0x13187b;
  bson_destroy(acStack_1000);
  pvVar10 = (void *)((long)pvVar10 + 0x10);
  pcVar11 = acStack_1000;
  pvVar9 = pvVar12;
  if (pvVar10 == (void *)0x40) {
    lVar5 = 8;
    do {
      apcStack_1088[0] = (code *)0x131898;
      bson_destroy(*(undefined8 *)((long)&pcStack_1040 + lVar5));
      lVar5 = lVar5 + 0x10;
    } while (lVar5 != 0x48);
    return;
  }
  goto LAB_001317fb;
  while( true ) {
    if (*(char *)((long)pvStack_1050 + uVar22) != *(char *)((long)pvVar12 + uVar22)) {
      uVar20 = uVar22 & 0xffffffff;
      break;
    }
    uVar22 = uVar22 + 1;
    if (uStack_ffc == (uint)uVar22) break;
LAB_001318fb:
    if (*(int *)(pcVar23 + 4) == (int)uVar22) break;
  }
LAB_00131915:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_ffc;
    if (uStack_ffc < *(uint *)(pcVar23 + 4)) {
      uVar3 = *(uint *)(pcVar23 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_1088[0] = (code *)0x131945;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,pcVar8,uVar6);
  apcStack_1088[0] = (code *)0x13195d;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  pcVar11 = (char *)(ulong)uVar3;
  apcStack_1088[0] = (code *)0x131978;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_1050 = (void *)CONCAT44(pvStack_1050._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_001319c9:
    apcStack_1088[0] = (code *)0x1319ce;
    test_bson_json_dbref_cold_6();
LAB_001319ce:
    apcStack_1088[0] = (code *)0x1319d3;
    test_bson_json_dbref_cold_5();
LAB_001319d3:
    apcStack_1088[0] = (code *)0x1319d8;
    test_bson_json_dbref_cold_2();
  }
  else {
    pcVar8 = (char *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_001319ce;
    pcVar11 = (char *)(ulong)uStack_ffc;
    apcStack_1088[0] = (code *)0x1319a2;
    pcVar25 = (char *)write(uVar3,pvVar9,(size_t)pcVar11);
    if (pcVar25 != pcVar11) goto LAB_001319d3;
    pcVar23 = (char *)(ulong)*(uint *)(pcVar23 + 4);
    apcStack_1088[0] = (code *)0x1319b8;
    pcVar25 = (char *)write(uVar4,pvVar12,(size_t)pcVar23);
    if (pcVar25 == pcVar23) {
      apcStack_1088[0] = (code *)0x1319c9;
      test_bson_json_dbref_cold_4();
      goto LAB_001319c9;
    }
  }
  apcStack_1088[0] = (code *)0x1319dd;
  test_bson_json_dbref_cold_3();
LAB_001319dd:
  apcStack_1088[0] = test_bson_json_uescape;
  test_bson_json_dbref_cold_1();
  apcStack_1488[0] = (code *)0x131a07;
  pcStack_10b0 = pcVar23;
  pcStack_10a8 = pcVar11;
  pcStack_10a0 = pcVar8;
  pcStack_1098 = (char *)pvVar12;
  pcStack_1090 = (char *)pvVar9;
  apcStack_1088[0] = (code *)&pcStack_c88;
  uVar6 = bson_bcon_magic();
  apcStack_1488[0] = (code *)0x131a29;
  pvStack_1478 = (void *)bcon_new(0,"euro",uVar6,0,anon_var_dwarf_49b7 + 0xc,0);
  apcStack_1488[0] = (code *)0x131a4d;
  pvVar9 = (void *)bcon_new(0,"crlf",uVar6,0,"\r\n",0);
  apcStack_1488[0] = (code *)0x131a6f;
  __n = (undefined1 *)bcon_new(0,"quote",uVar6,0,"\"",0);
  apcStack_1488[0] = (code *)0x131a91;
  __s1 = (undefined1 *)bcon_new(0,"backslash",uVar6,0,"\\",0);
  apcStack_1488[0] = (code *)0x131aaf;
  uVar7 = bcon_new(0,"",uVar6,0,"",0);
  apcStack_1488[0] = (code *)0x131ad1;
  uVar6 = bcon_new(0,"escapes",uVar6,0,"\f\b\t",0);
  apcStack_1488[0] = (code *)0x131ad9;
  uStack_1408 = bson_new();
  pcStack_1470 = "{ \"euro\": \"\\u20AC\"}";
  pvStack_1468 = pvStack_1478;
  pcStack_1460 = "{ \"crlf\": \"\\r\\n\"}";
  pcStack_1450 = "{ \"quote\": \"\\\"\"}";
  pcStack_1440 = "{ \"backslash\": \"\\\\\"}";
  pcStack_1430 = "{ \"\": \"\"}";
  pcStack_1420 = "{ \"escapes\": \"\\f\\b\\t\"}";
  pcStack_1410 = "{ \"nil\": \"\\u0000\"}";
  apcStack_1488[0] = (code *)0x131b76;
  pvStack_1458 = pvVar9;
  puStack_1448 = __n;
  puStack_1438 = __s1;
  uStack_1428 = uVar7;
  uStack_1418 = uVar6;
  bson_append_utf8(uStack_1408,"nil",0xffffffff,"",1);
  pvVar10 = (void *)0x8;
  while( true ) {
    apcStack_1488[0] = (code *)0x131ba0;
    cVar1 = bson_init_from_json(auStack_1400,*(undefined8 *)((long)&pvStack_1478 + (long)pvVar10),
                                0xffffffffffffffff,auStack_1338);
    puVar14 = auStack_1400;
    pvVar12 = pvVar10;
    if (cVar1 == '\0') break;
    apcStack_1488[0] = (code *)0x131bb3;
    pvStack_1478 = (void *)bson_get_data(auStack_1400);
    puVar14 = *(undefined1 **)((long)&pcStack_1470 + (long)pvVar10);
    apcStack_1488[0] = (code *)0x131bc5;
    pvVar12 = (void *)bson_get_data(puVar14);
    if (*(uint *)(puVar14 + 4) != uStack_13fc) {
LAB_00131c3a:
      apcStack_1488[0] = (code *)0x131c4c;
      __s1 = (undefined1 *)bson_as_canonical_extended_json(auStack_1400);
      apcStack_1488[0] = (code *)0x131c59;
      uVar6 = bson_as_canonical_extended_json(puVar14);
      pvVar9 = pvStack_1478;
      uVar20 = 0xffffffff;
      if (uStack_13fc == 0) goto LAB_00131c9e;
      uVar22 = 0;
      goto LAB_00131c84;
    }
    apcStack_1488[0] = (code *)0x131bdc;
    __s1 = (undefined1 *)bson_get_data(puVar14);
    apcStack_1488[0] = (code *)0x131be7;
    pvVar9 = (void *)bson_get_data(auStack_1400);
    apcStack_1488[0] = (code *)0x131bf5;
    iVar2 = bcmp(__s1,pvVar9,(ulong)*(uint *)(puVar14 + 4));
    if (iVar2 != 0) goto LAB_00131c3a;
    apcStack_1488[0] = (code *)0x131c04;
    bson_destroy(auStack_1400);
    pvVar10 = (void *)((long)pvVar10 + 0x10);
    __n = auStack_1400;
    pvVar9 = pvVar12;
    if (pvVar10 == (void *)0x78) {
      lVar5 = 8;
      do {
        apcStack_1488[0] = (code *)0x131c21;
        bson_destroy(*(undefined8 *)((long)&pcStack_1470 + lVar5));
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x78);
      return;
    }
  }
  goto LAB_00131d66;
  while( true ) {
    if (*(char *)((long)pvStack_1478 + uVar22) != *(char *)((long)pvVar12 + uVar22)) {
      uVar20 = uVar22 & 0xffffffff;
      break;
    }
    uVar22 = uVar22 + 1;
    if (uStack_13fc == (uint)uVar22) break;
LAB_00131c84:
    if (*(int *)(puVar14 + 4) == (int)uVar22) break;
  }
LAB_00131c9e:
  if ((int)uVar20 == -1) {
    uVar3 = uStack_13fc;
    if (uStack_13fc < *(uint *)(puVar14 + 4)) {
      uVar3 = *(uint *)(puVar14 + 4);
    }
    uVar20 = (ulong)(uVar3 - 1);
  }
  apcStack_1488[0] = (code *)0x131cce;
  fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,__s1,uVar6);
  apcStack_1488[0] = (code *)0x131ce6;
  uVar3 = open("failure.bad.bson",0x42,0x1a0);
  __n = (undefined1 *)(ulong)uVar3;
  apcStack_1488[0] = (code *)0x131d01;
  uVar4 = open("failure.expected.bson",0x42,0x1a0);
  pvStack_1478 = (void *)CONCAT44(pvStack_1478._4_4_,uVar3);
  if (uVar3 == 0xffffffff) {
LAB_00131d52:
    apcStack_1488[0] = (code *)0x131d57;
    test_bson_json_uescape_cold_6();
LAB_00131d57:
    apcStack_1488[0] = (code *)0x131d5c;
    test_bson_json_uescape_cold_5();
LAB_00131d5c:
    apcStack_1488[0] = (code *)0x131d61;
    test_bson_json_uescape_cold_2();
  }
  else {
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131d57;
    __n = (undefined1 *)(ulong)uStack_13fc;
    apcStack_1488[0] = (code *)0x131d2b;
    puVar13 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
    if (puVar13 != __n) goto LAB_00131d5c;
    puVar14 = (undefined1 *)(ulong)*(uint *)(puVar14 + 4);
    apcStack_1488[0] = (code *)0x131d41;
    puVar13 = (undefined1 *)write(uVar4,pvVar12,(size_t)puVar14);
    if (puVar13 == puVar14) {
      apcStack_1488[0] = (code *)0x131d52;
      test_bson_json_uescape_cold_4();
      goto LAB_00131d52;
    }
  }
  apcStack_1488[0] = (code *)0x131d66;
  test_bson_json_uescape_cold_3();
LAB_00131d66:
  apcStack_1488[0] = test_bson_json_uescape_key;
  test_bson_json_uescape_cold_1();
  apcStack_1888[0] = (code *)0x131d90;
  puStack_14b0 = puVar14;
  puStack_14a8 = __n;
  puStack_14a0 = __s1;
  pvStack_1498 = pvVar12;
  pvStack_1490 = pvVar9;
  apcStack_1488[0] = (code *)apcStack_1088;
  uVar6 = bson_bcon_magic();
  apcStack_1888[0] = (code *)0x131daf;
  pcVar11 = (char *)bcon_new(0,anon_var_dwarf_49b7 + 0xc,uVar6,0,"euro",0);
  apcStack_1888[0] = (code *)0x131dd5;
  cVar1 = bson_init_from_json(auStack_1800,"{ \"\\u20AC\": \"euro\"}",0xffffffffffffffff,
                              auStack_1738);
  if (cVar1 == '\0') {
LAB_00131f51:
    apcStack_1888[0] = (code *)0x131f56;
    test_bson_json_uescape_key_cold_1();
LAB_00131f56:
    apcStack_1888[0] = (code *)0x131f5b;
    test_bson_json_uescape_key_cold_6();
LAB_00131f5b:
    apcStack_1888[0] = (code *)0x131f60;
    test_bson_json_uescape_key_cold_5();
LAB_00131f60:
    apcStack_1888[0] = (code *)0x131f65;
    test_bson_json_uescape_key_cold_2();
  }
  else {
    apcStack_1888[0] = (code *)0x131ded;
    pvVar9 = (void *)bson_get_data(auStack_1800);
    apcStack_1888[0] = (code *)0x131df8;
    pvVar12 = (void *)bson_get_data(pcVar11);
    if (*(uint *)(pcVar11 + 4) == uStack_17fc) {
      apcStack_1888[0] = (code *)0x131e0d;
      pvVar10 = (void *)bson_get_data(pcVar11);
      apcStack_1888[0] = (code *)0x131e1d;
      __s2 = (void *)bson_get_data(auStack_1800);
      apcStack_1888[0] = (code *)0x131e2b;
      iVar2 = bcmp(pvVar10,__s2,(ulong)*(uint *)(pcVar11 + 4));
      if (iVar2 == 0) {
        apcStack_1888[0] = (code *)0x131e3c;
        bson_destroy(auStack_1800);
        apcStack_1888[0] = (code *)0x131e44;
        bson_destroy(pcVar11);
        return;
      }
    }
    __s1 = auStack_1800;
    apcStack_1888[0] = (code *)0x131e65;
    uVar6 = bson_as_canonical_extended_json(__s1);
    apcStack_1888[0] = (code *)0x131e72;
    uVar7 = bson_as_canonical_extended_json(pcVar11);
    uVar20 = 0xffffffff;
    if (uStack_17fc != 0) {
      uVar22 = 0;
      do {
        if (*(int *)(pcVar11 + 4) == (int)uVar22) break;
        if (*(char *)((long)pvVar9 + uVar22) != *(char *)((long)pvVar12 + uVar22)) {
          uVar20 = uVar22 & 0xffffffff;
          break;
        }
        uVar22 = uVar22 + 1;
      } while (uStack_17fc != (uint)uVar22);
    }
    if ((int)uVar20 == -1) {
      uVar3 = uStack_17fc;
      if (uStack_17fc < *(uint *)(pcVar11 + 4)) {
        uVar3 = *(uint *)(pcVar11 + 4);
      }
      uVar20 = (ulong)(uVar3 - 1);
    }
    apcStack_1888[0] = (code *)0x131ecd;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar20,uVar6,uVar7);
    apcStack_1888[0] = (code *)0x131ee5;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    __n = (undefined1 *)(ulong)uVar3;
    apcStack_1888[0] = (code *)0x131f00;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_1804 = uVar3;
    if (uVar3 == 0xffffffff) goto LAB_00131f56;
    __s1 = (undefined1 *)(ulong)uVar4;
    if (uVar4 == 0xffffffff) goto LAB_00131f5b;
    __n = (undefined1 *)(ulong)uStack_17fc;
    apcStack_1888[0] = (code *)0x131f2a;
    puVar14 = (undefined1 *)write(uVar3,pvVar9,(size_t)__n);
    if (puVar14 != __n) goto LAB_00131f60;
    pcVar11 = (char *)(ulong)*(uint *)(pcVar11 + 4);
    apcStack_1888[0] = (code *)0x131f40;
    pcVar8 = (char *)write(uVar4,pvVar12,(size_t)pcVar11);
    if (pcVar8 == pcVar11) {
      apcStack_1888[0] = (code *)0x131f51;
      test_bson_json_uescape_key_cold_4();
      goto LAB_00131f51;
    }
  }
  apcStack_1888[0] = test_bson_json_uescape_bad;
  test_bson_json_uescape_key_cold_3();
  pcStack_1c08 = (code *)0x131f98;
  pcStack_1890 = pcVar11;
  apcStack_1888[0] = (code *)apcStack_1488;
  cVar1 = bson_init_from_json(auStack_1c00,"{ \"bad\": \"\\u1\"}",0xffffffffffffffff,&iStack_1b18);
  if (cVar1 == '\0') {
    if (iStack_1b18 != 1) goto LAB_00131fe4;
    if (iStack_1b14 != 1) goto LAB_00131fe9;
    pcVar11 = acStack_1b10;
    pcStack_1c08 = (code *)0x131fcb;
    pcVar8 = strstr(pcVar11,"UESCAPE_TOOSHORT");
    if (pcVar8 != (char *)0x0) {
      pcStack_1c08 = (code *)0x131fd8;
      bson_destroy(auStack_1c00);
      return;
    }
  }
  else {
    pcStack_1c08 = (code *)0x131fe4;
    test_bson_json_uescape_bad_cold_4();
LAB_00131fe4:
    pcStack_1c08 = (code *)0x131fe9;
    test_bson_json_uescape_bad_cold_1();
LAB_00131fe9:
    pcStack_1c08 = (code *)0x131fee;
    test_bson_json_uescape_bad_cold_2();
  }
  pcStack_1c08 = test_bson_json_int32;
  test_bson_json_uescape_bad_cold_3();
  pcStack_2008 = (code *)0x132029;
  pcStack_1c10 = pcVar11;
  pcStack_1c08 = (code *)apcStack_1888;
  cVar1 = bson_init_from_json(acStack_1f80,"{ \"x\": 2147483647 }",0xffffffffffffffff,auStack_1e98);
  if (cVar1 == '\0') {
LAB_0013221b:
    pcStack_2008 = (code *)0x132228;
    test_bson_json_int32_cold_1();
LAB_00132228:
    pcStack_2008 = (code *)0x132230;
    test_bson_json_int32_cold_4();
LAB_00132230:
    pcStack_2008 = (code *)0x13223d;
    test_bson_json_int32_cold_5();
  }
  else {
    pcStack_2008 = (code *)0x132048;
    cVar1 = bson_iter_init_find(auStack_2000,acStack_1f80,"x");
    if (cVar1 == '\0') {
      pcStack_2008 = (code *)0x1321f8;
      test_bson_json_int32_cold_2();
LAB_001321f8:
      pcStack_2008 = (code *)0x1321fd;
      test_bson_json_int32_cold_3();
LAB_001321fd:
      pcStack_2008 = (code *)0x132202;
      test_bson_json_int32_cold_6();
LAB_00132202:
      pcStack_2008 = (code *)0x132207;
      test_bson_json_int32_cold_7();
      pcStack_2008 = (code *)0x13220c;
      test_bson_json_int32_cold_10();
      pcStack_2008 = (code *)0x132211;
      test_bson_json_int32_cold_11();
      pcStack_2008 = (code *)0x132216;
      test_bson_json_int32_cold_14();
      pcStack_2008 = (code *)0x13221b;
      test_bson_json_int32_cold_15();
      goto LAB_0013221b;
    }
    pcStack_2008 = (code *)0x132058;
    iVar2 = bson_iter_type(auStack_2000);
    if (iVar2 != 0x10) goto LAB_001321f8;
    pcStack_2008 = (code *)0x132069;
    iVar2 = bson_iter_int32(auStack_2000);
    if (iVar2 != 0x7fffffff) goto LAB_00132228;
    pcVar11 = acStack_1f80;
    pcStack_2008 = (code *)0x132084;
    bson_destroy(pcVar11);
    pcStack_2008 = (code *)0x1320a2;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": -2147483648 }",0xffffffffffffffff,auStack_1e98);
    if (cVar1 == '\0') goto LAB_00132230;
    pcStack_2008 = (code *)0x1320c1;
    cVar1 = bson_iter_init_find(auStack_2000,acStack_1f80,"x");
    if (cVar1 == '\0') goto LAB_001321fd;
    pcStack_2008 = (code *)0x1320d1;
    iVar2 = bson_iter_type(auStack_2000);
    if (iVar2 != 0x10) goto LAB_00132202;
    pcStack_2008 = (code *)0x1320e2;
    bson_iter_int32(auStack_2000);
  }
  pcStack_2008 = (code *)0x132245;
  test_bson_json_int32_cold_8();
  pcStack_2008 = (code *)0x132252;
  test_bson_json_int32_cold_9();
  pcStack_2008 = (code *)0x13225a;
  test_bson_json_int32_cold_12();
  pcStack_2008 = (code *)0x132267;
  test_bson_json_int32_cold_13();
  pcStack_2008 = test_bson_json_int64;
  test_bson_json_int32_cold_16();
  pcStack_2408 = (code *)0x1322a4;
  pcStack_2018 = pcVar11;
  pvStack_2010 = pvVar12;
  pcStack_2008 = (code *)&pcStack_1c08;
  cVar1 = bson_init_from_json(acStack_2380,"{ \"x\": 9223372036854775807 }",0xffffffffffffffff,
                              &iStack_22a0);
  if (cVar1 == '\0') {
LAB_0013253d:
    pcStack_2408 = (code *)0x13254a;
    test_bson_json_int64_cold_1();
LAB_0013254a:
    pcStack_2408 = (code *)0x132552;
    test_bson_json_int64_cold_4();
LAB_00132552:
    pcStack_2408 = (code *)0x13255f;
    test_bson_json_int64_cold_5();
LAB_0013255f:
    pcStack_2408 = (code *)0x132567;
    test_bson_json_int64_cold_8();
LAB_00132567:
    pcStack_2408 = (code *)0x13256c;
    test_bson_json_int64_cold_9();
LAB_0013256c:
    pcStack_2408 = (code *)0x132571;
    test_bson_json_int64_cold_10();
LAB_00132571:
    pcStack_2408 = (code *)0x132579;
    test_bson_json_int64_cold_23();
LAB_00132579:
    pcStack_2408 = (code *)0x13257e;
    test_bson_json_int64_cold_11();
LAB_0013257e:
    pcStack_2408 = (code *)0x132583;
    test_bson_json_int64_cold_12();
LAB_00132583:
    pcStack_2408 = (code *)0x13258b;
    test_bson_json_int64_cold_21();
LAB_0013258b:
    pcStack_2408 = (code *)0x132590;
    test_bson_json_int64_cold_13();
LAB_00132590:
    pcStack_2408 = (code *)0x132595;
    test_bson_json_int64_cold_14();
LAB_00132595:
    pcStack_2408 = (code *)0x13259d;
    test_bson_json_int64_cold_19();
LAB_0013259d:
    pcStack_2408 = (code *)0x1325a2;
    test_bson_json_int64_cold_15();
LAB_001325a2:
    pcStack_2408 = (code *)0x1325a7;
    test_bson_json_int64_cold_16();
  }
  else {
    pcStack_2408 = (code *)0x1322c3;
    cVar1 = bson_iter_init_find(auStack_2400,acStack_2380,"x");
    if (cVar1 == '\0') {
      pcStack_2408 = (code *)0x13251a;
      test_bson_json_int64_cold_2();
LAB_0013251a:
      pcStack_2408 = (code *)0x13251f;
      test_bson_json_int64_cold_3();
LAB_0013251f:
      pcStack_2408 = (code *)0x132524;
      test_bson_json_int64_cold_6();
LAB_00132524:
      pcStack_2408 = (code *)0x132529;
      test_bson_json_int64_cold_7();
LAB_00132529:
      pcStack_2408 = (code *)0x13252e;
      test_bson_json_int64_cold_24();
LAB_0013252e:
      pcStack_2408 = (code *)0x132533;
      test_bson_json_int64_cold_22();
LAB_00132533:
      pcStack_2408 = (code *)0x132538;
      test_bson_json_int64_cold_20();
LAB_00132538:
      pcStack_2408 = (code *)0x13253d;
      test_bson_json_int64_cold_18();
      goto LAB_0013253d;
    }
    pcStack_2408 = (code *)0x1322d3;
    iVar2 = bson_iter_type(auStack_2400);
    if (iVar2 != 0x12) goto LAB_0013251a;
    pvVar12 = (void *)0x7fffffffffffffff;
    pcStack_2408 = (code *)0x1322ee;
    lVar5 = bson_iter_int64(auStack_2400);
    if (lVar5 != 0x7fffffffffffffff) goto LAB_0013254a;
    pcVar11 = acStack_2380;
    pcStack_2408 = (code *)0x132307;
    bson_destroy(pcVar11);
    pcStack_2408 = (code *)0x132325;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": -9223372036854775808 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 == '\0') goto LAB_00132552;
    pcStack_2408 = (code *)0x132344;
    cVar1 = bson_iter_init_find(auStack_2400,acStack_2380,"x");
    if (cVar1 == '\0') goto LAB_0013251f;
    pcStack_2408 = (code *)0x132354;
    iVar2 = bson_iter_type(auStack_2400);
    if (iVar2 != 0x12) goto LAB_00132524;
    pcStack_2408 = (code *)0x132365;
    lVar5 = bson_iter_int64(auStack_2400);
    pvVar12 = (void *)0x8000000000000000;
    if (lVar5 != -0x8000000000000000) goto LAB_0013255f;
    pcVar11 = acStack_2380;
    pcStack_2408 = (code *)0x132381;
    bson_destroy(pcVar11);
    pcStack_2408 = (code *)0x13239f;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": 9223372036854775808 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 != '\0') goto LAB_00132529;
    if (iStack_22a0 != 1) goto LAB_00132567;
    if (iStack_229c != 2) goto LAB_0013256c;
    pcVar11 = acStack_2298;
    pcStack_2408 = (code *)0x1323de;
    pcVar8 = strstr(pcVar11,"Number \"9223372036854775808\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00132571;
    pcStack_2408 = (code *)0x13240a;
    cVar1 = bson_init_from_json(acStack_2380,"{ \"x\": -9223372036854775809 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 != '\0') goto LAB_0013252e;
    if (iStack_22a0 != 1) goto LAB_00132579;
    if (iStack_229c != 2) goto LAB_0013257e;
    pcStack_2408 = (code *)0x132441;
    pcVar8 = strstr(pcVar11,"Number \"-9223372036854775809\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00132583;
    pcStack_2408 = (code *)0x13246d;
    cVar1 = bson_init_from_json(acStack_2380,"{ \"x\": 10000000000000000000 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 != '\0') goto LAB_00132533;
    if (iStack_22a0 != 1) goto LAB_0013258b;
    if (iStack_229c != 2) goto LAB_00132590;
    pcStack_2408 = (code *)0x1324a4;
    pcVar8 = strstr(pcVar11,"Number \"10000000000000000000\" is out of range");
    if (pcVar8 == (char *)0x0) goto LAB_00132595;
    pcStack_2408 = (code *)0x1324d0;
    cVar1 = bson_init_from_json(acStack_2380,"{ \"x\": -10000000000000000000 }",0xffffffffffffffff,
                                &iStack_22a0);
    if (cVar1 != '\0') goto LAB_00132538;
    if (iStack_22a0 != 1) goto LAB_0013259d;
    if (iStack_229c != 2) goto LAB_001325a2;
    pcStack_2408 = (code *)0x132503;
    pcVar8 = strstr(pcVar11,"Number \"-10000000000000000000\" is out of range");
    if (pcVar8 != (char *)0x0) {
      return;
    }
  }
  pcStack_2408 = test_bson_json_double;
  test_bson_json_int64_cold_17();
  pcStack_2808 = (code *)0x1325e2;
  pcStack_2410 = pcVar11;
  pcStack_2408 = (code *)&pcStack_2008;
  cVar1 = bson_init_from_json(acStack_2780,"{ \"x\": 1 }",0xffffffffffffffff,auStack_2698);
  if (cVar1 == '\0') {
LAB_00132887:
    pcStack_2808 = (code *)0x132894;
    test_bson_json_double_cold_1();
LAB_00132894:
    pcStack_2808 = (code *)0x13289c;
    test_bson_json_double_cold_4();
LAB_0013289c:
    pcStack_2808 = (code *)0x1328a9;
    test_bson_json_double_cold_5();
LAB_001328a9:
    pcStack_2808 = (code *)0x1328b1;
    test_bson_json_double_cold_8();
LAB_001328b1:
    pcStack_2808 = (code *)0x1328be;
    test_bson_json_double_cold_9();
LAB_001328be:
    pcStack_2808 = (code *)0x1328c6;
    test_bson_json_double_cold_12();
LAB_001328c6:
    pcStack_2808 = (code *)0x1328d3;
    test_bson_json_double_cold_13();
LAB_001328d3:
    pcStack_2808 = (code *)0x1328db;
    test_bson_json_double_cold_16();
LAB_001328db:
    pcStack_2808 = (code *)0x1328e8;
    test_bson_json_double_cold_17();
  }
  else {
    pcStack_2808 = (code *)0x132601;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') {
      pcStack_2808 = (code *)0x132855;
      test_bson_json_double_cold_2();
LAB_00132855:
      pcStack_2808 = (code *)0x13285a;
      test_bson_json_double_cold_3();
LAB_0013285a:
      pcStack_2808 = (code *)0x13285f;
      test_bson_json_double_cold_6();
LAB_0013285f:
      pcStack_2808 = (code *)0x132864;
      test_bson_json_double_cold_7();
LAB_00132864:
      pcStack_2808 = (code *)0x132869;
      test_bson_json_double_cold_10();
LAB_00132869:
      pcStack_2808 = (code *)0x13286e;
      test_bson_json_double_cold_11();
LAB_0013286e:
      pcStack_2808 = (code *)0x132873;
      test_bson_json_double_cold_14();
LAB_00132873:
      pcStack_2808 = (code *)0x132878;
      test_bson_json_double_cold_15();
LAB_00132878:
      pcStack_2808 = (code *)0x13287d;
      test_bson_json_double_cold_18();
LAB_0013287d:
      pcStack_2808 = (code *)0x132882;
      test_bson_json_double_cold_19();
LAB_00132882:
      pcStack_2808 = (code *)0x132887;
      test_bson_json_double_cold_21();
      goto LAB_00132887;
    }
    pcStack_2808 = (code *)0x132611;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 0x10) goto LAB_00132855;
    pcStack_2808 = (code *)0x132622;
    iVar2 = bson_iter_int32(auStack_2800);
    if (iVar2 != 1) goto LAB_00132894;
    pcVar11 = acStack_2780;
    pcStack_2808 = (code *)0x13263b;
    bson_destroy(pcVar11);
    pcStack_2808 = (code *)0x132659;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": 4294967296 }",0xffffffffffffffff,auStack_2698);
    if (cVar1 == '\0') goto LAB_0013289c;
    pcStack_2808 = (code *)0x132678;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') goto LAB_0013285a;
    pcStack_2808 = (code *)0x132688;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 0x12) goto LAB_0013285f;
    pcStack_2808 = (code *)0x132699;
    lVar5 = bson_iter_int64(auStack_2800);
    if (lVar5 != 0x100000000) goto LAB_001328a9;
    pcVar11 = acStack_2780;
    pcStack_2808 = (code *)0x1326bc;
    bson_destroy(pcVar11);
    pcStack_2808 = (code *)0x1326da;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": 1.0 }",0xffffffffffffffff,auStack_2698);
    if (cVar1 == '\0') goto LAB_001328b1;
    pcStack_2808 = (code *)0x1326f9;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') goto LAB_00132864;
    pcStack_2808 = (code *)0x132709;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 1) goto LAB_00132869;
    pcStack_2808 = (code *)0x13271a;
    dVar30 = (double)bson_iter_double(auStack_2800);
    if ((dVar30 != 1.0) || (NAN(dVar30))) goto LAB_001328be;
    pcVar11 = acStack_2780;
    pcStack_2808 = (code *)0x13273e;
    bson_destroy(pcVar11);
    pcStack_2808 = (code *)0x13275c;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": 0.0 }",0xffffffffffffffff,auStack_2698);
    if (cVar1 == '\0') goto LAB_001328c6;
    pcStack_2808 = (code *)0x13277b;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') goto LAB_0013286e;
    pcStack_2808 = (code *)0x13278b;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 1) goto LAB_00132873;
    pcStack_2808 = (code *)0x13279c;
    dVar30 = (double)bson_iter_double(auStack_2800);
    if ((dVar30 != 0.0) || (NAN(dVar30))) goto LAB_001328d3;
    pcVar11 = acStack_2780;
    pcStack_2808 = (code *)0x1327c0;
    bson_destroy(pcVar11);
    pcStack_2808 = (code *)0x1327de;
    cVar1 = bson_init_from_json(pcVar11,"{ \"x\": -0.0 }",0xffffffffffffffff,auStack_2698);
    if (cVar1 == '\0') goto LAB_001328db;
    pcStack_2808 = (code *)0x1327fd;
    cVar1 = bson_iter_init_find(auStack_2800,acStack_2780,"x");
    if (cVar1 == '\0') goto LAB_00132878;
    pcStack_2808 = (code *)0x132809;
    iVar2 = bson_iter_type(auStack_2800);
    if (iVar2 != 1) goto LAB_0013287d;
    pcStack_2808 = (code *)0x132816;
    dVar30 = (double)bson_iter_double(auStack_2800);
    if ((dVar30 == 0.0) && (!NAN(dVar30))) {
      pcStack_2808 = (code *)0x132832;
      bson_iter_double(auStack_2800);
      if (extraout_XMM0_Db < 0) {
        pcStack_2808 = (code *)0x132849;
        bson_destroy(acStack_2780);
        return;
      }
      goto LAB_00132882;
    }
  }
  pcStack_2808 = test_bson_json_double_overflow;
  test_bson_json_double_cold_20();
  pcVar8 = "2e400";
  ppuVar28 = &PTR_anon_var_dwarf_1affa_00161308;
  pcStack_2830 = pcVar11;
  puStack_2828 = __n;
  puStack_2820 = __s1;
  pvStack_2818 = pvVar12;
  pvStack_2810 = pvVar9;
  pcStack_2808 = (code *)&pcStack_2408;
  while( true ) {
    pcStack_2b88 = (code *)0x13292e;
    uVar6 = bson_strdup_printf("{ \"d\" : %s }",pcVar8);
    pcStack_2b88 = (code *)0x13294b;
    cVar1 = bson_init_from_json(auStack_2980,uVar6,0xffffffffffffffff,&iStack_2b80);
    if (cVar1 != '\0') break;
    if (iStack_2b80 != 1) goto LAB_00132a15;
    if (iStack_2b7c != 2) goto LAB_00132a10;
    pcStack_2b88 = (code *)0x132979;
    pcVar11 = strstr(acStack_2b78,"out of range");
    if (pcVar11 == (char *)0x0) goto LAB_00132a1a;
    pcStack_2b88 = (code *)0x13298a;
    bson_free(uVar6);
    pcStack_2b88 = (code *)0x13299b;
    uVar6 = bson_strdup_printf("{ \"d\" : { \"$numberDouble\" : \"%s\" } }",pcVar8);
    pcStack_2b88 = (code *)0x1329b8;
    cVar1 = bson_init_from_json(auStack_2980,uVar6,0xffffffffffffffff,&iStack_2b80);
    if (cVar1 != '\0') goto LAB_00132a0b;
    if (iStack_2b80 != 1) goto LAB_00132a29;
    if (iStack_2b7c != 2) goto LAB_00132a24;
    pcStack_2b88 = (code *)0x1329da;
    pcVar11 = strstr(acStack_2b78,"out of range");
    if (pcVar11 == (char *)0x0) goto LAB_00132a2e;
    pcStack_2b88 = (code *)0x1329e7;
    bson_free(uVar6);
    pcVar8 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
  pcStack_2b88 = (code *)0x132a0b;
  test_bson_json_double_overflow_cold_8();
LAB_00132a0b:
  pcStack_2b88 = (code *)0x132a10;
  test_bson_json_double_overflow_cold_6();
LAB_00132a10:
  pcStack_2b88 = (code *)0x132a15;
  test_bson_json_double_overflow_cold_2();
LAB_00132a15:
  pcStack_2b88 = (code *)0x132a1a;
  test_bson_json_double_overflow_cold_1();
LAB_00132a1a:
  pcStack_2b88 = (code *)0x132a24;
  test_bson_json_double_overflow_cold_7();
LAB_00132a24:
  pcStack_2b88 = (code *)0x132a29;
  test_bson_json_double_overflow_cold_4();
LAB_00132a29:
  pcStack_2b88 = (code *)0x132a2e;
  test_bson_json_double_overflow_cold_3();
LAB_00132a2e:
  pcStack_2b88 = test_bson_json_nan;
  test_bson_json_double_overflow_cold_5();
  pcStack_2ba0 = "out of range";
  pcVar23 = "{ \"d\": NaN }";
  ppuVar27 = &PTR_anon_var_dwarf_1b04e_00161328;
  piVar21 = aiStack_2f00;
  piVar15 = &iStack_2e38;
  piVar29 = (int *)0x14a6f6;
  pcVar11 = (char *)&dStack_2f08;
  uStack_2bb0 = uVar6;
  puStack_2ba8 = (undefined1 *)&iStack_2b80;
  pcStack_2b98 = pcVar8;
  ppuStack_2b90 = ppuVar28;
  pcStack_2b88 = (code *)&pcStack_2808;
  do {
    apcStack_2f88[0] = (code *)0x132a8c;
    cVar1 = bson_init_from_json(piVar21,pcVar23,0xffffffffffffffff,piVar15);
    if (cVar1 == '\0') {
      apcStack_2f88[0] = (code *)0x132bf5;
      test_bson_json_nan_cold_1();
LAB_00132bf5:
      apcStack_2f88[0] = (code *)0x132bfa;
      test_bson_json_nan_cold_2();
LAB_00132bfa:
      apcStack_2f88[0] = (code *)0x132bff;
      test_bson_json_nan_cold_3();
      goto LAB_00132bff;
    }
    apcStack_2f88[0] = (code *)0x132a99;
    uVar6 = bson_bcone_magic();
    apcStack_2f88[0] = (code *)0x132ab4;
    cVar1 = bcon_extract(piVar21,"d",uVar6,1,pcVar11,0);
    if (cVar1 == '\0') goto LAB_00132bf5;
    if (!NAN(dStack_2f08) && !NAN(dStack_2f08)) goto LAB_00132bfa;
    apcStack_2f88[0] = (code *)0x132ad4;
    bson_destroy(piVar21);
    pcVar23 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar23 != (char *)0x0);
  pcVar8 = "{ \"d\": NaNn }";
  ppuVar27 = &PTR_anon_var_dwarf_1b07e_00161358;
  piVar21 = aiStack_2e30;
  piVar15 = aiStack_2f00;
  piVar29 = &iStack_2e38;
  pcVar11 = "Got parse error at";
  do {
    apcStack_2f88[0] = (code *)0x132b20;
    cVar1 = bson_init_from_json(piVar15,pcVar8,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') goto LAB_00132bff;
    if (iStack_2e38 != 1) goto LAB_00132c16;
    if (iStack_2e34 != 1) goto LAB_00132c09;
    apcStack_2f88[0] = (code *)0x132b53;
    pcVar8 = strstr((char *)piVar21,"Got parse error at");
    if (pcVar8 == (char *)0x0) goto LAB_00132c0e;
    pcVar8 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar8 = "{ \"d\": nu";
  ppuVar27 = &PTR_anon_var_dwarf_1b0c6_00161398;
  piVar21 = aiStack_2e30;
  piVar15 = aiStack_2f00;
  piVar29 = &iStack_2e38;
  pcVar11 = "Incomplete JSON";
  while( true ) {
    apcStack_2f88[0] = (code *)0x132ba8;
    cVar1 = bson_init_from_json(piVar15,pcVar8,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') break;
    if (iStack_2e38 != 1) goto LAB_00132c28;
    if (iStack_2e34 != 1) goto LAB_00132c1b;
    apcStack_2f88[0] = (code *)0x132bcf;
    pcVar8 = strstr((char *)piVar21,"Incomplete JSON");
    if (pcVar8 == (char *)0x0) goto LAB_00132c20;
    pcVar8 = *ppuVar27;
    ppuVar27 = ppuVar27 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
LAB_00132c04:
  apcStack_2f88[0] = (code *)0x132c09;
  test_bson_json_nan_cold_9();
LAB_00132c09:
  apcStack_2f88[0] = (code *)0x132c0e;
  test_bson_json_nan_cold_5();
LAB_00132c0e:
  apcStack_2f88[0] = (code *)0x132c16;
  test_bson_json_nan_cold_10();
LAB_00132c16:
  apcStack_2f88[0] = (code *)0x132c1b;
  test_bson_json_nan_cold_4();
LAB_00132c1b:
  apcStack_2f88[0] = (code *)0x132c20;
  test_bson_json_nan_cold_7();
LAB_00132c20:
  apcStack_2f88[0] = (code *)0x132c28;
  test_bson_json_nan_cold_8();
LAB_00132c28:
  apcStack_2f88[0] = test_bson_json_infinity;
  test_bson_json_nan_cold_6();
  pcVar8 = "{ \"d\": Infinity }";
  ppuVar28 = &PTR_anon_var_dwarf_1b13e_001613b8;
  piStack_2fb0 = piVar21;
  pdStack_2fa8 = (double *)pcVar11;
  ppuStack_2fa0 = ppuVar27;
  piStack_2f98 = piVar15;
  piStack_2f90 = piVar29;
  apcStack_2f88[0] = (code *)&pcStack_2b88;
  do {
    apcStack_3388[0] = (code *)0x132c81;
    cVar1 = bson_init_from_json(aiStack_3300,pcVar8,0xffffffffffffffff,&iStack_3238);
    if (cVar1 == '\0') {
      apcStack_3388[0] = (code *)0x132eb1;
      test_bson_json_infinity_cold_1();
LAB_00132eb1:
      apcStack_3388[0] = (code *)0x132eb6;
      test_bson_json_infinity_cold_2();
LAB_00132eb6:
      apcStack_3388[0] = (code *)0x132ebb;
      test_bson_json_infinity_cold_3();
      goto LAB_00132ebb;
    }
    apcStack_3388[0] = (code *)0x132c8e;
    uVar6 = bson_bcone_magic();
    apcStack_3388[0] = (code *)0x132ca9;
    cVar1 = bcon_extract(aiStack_3300,"d",uVar6,1,&dStack_3308,0);
    if (cVar1 == '\0') goto LAB_00132eb1;
    if ((NAN(dStack_3308)) || (!NAN(dStack_3308 - dStack_3308) && !NAN(dStack_3308 - dStack_3308)))
    goto LAB_00132eb6;
    apcStack_3388[0] = (code *)0x132cd7;
    bson_destroy(aiStack_3300);
    pcVar8 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar11 = "{ \"d\": -Infinity }";
  ppuVar28 = &PTR_anon_var_dwarf_1b162_001613d8;
  do {
    apcStack_3388[0] = (code *)0x132d20;
    cVar1 = bson_init_from_json(aiStack_3300,pcVar11,0xffffffffffffffff,&iStack_3238);
    if (cVar1 == '\0') goto LAB_00132ebb;
    apcStack_3388[0] = (code *)0x132d2d;
    uVar6 = bson_bcone_magic();
    apcStack_3388[0] = (code *)0x132d48;
    cVar1 = bcon_extract(aiStack_3300,"d",uVar6,1,&dStack_3308,0);
    if (cVar1 == '\0') goto LAB_00132ec0;
    if ((NAN(dStack_3308)) || (!NAN(dStack_3308 - dStack_3308))) goto LAB_00132ec5;
    if (0.0 <= dStack_3308) goto LAB_00132eca;
    apcStack_3388[0] = (code *)0x132d88;
    bson_destroy(aiStack_3300);
    pcVar11 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
  } while (pcVar11 != (char *)0x0);
  pcVar8 = "{ \"d\": Infinityy }";
  ppuVar28 = &PTR_anon_var_dwarf_1b186_001613f8;
  piVar21 = aiStack_3230;
  piVar15 = aiStack_3300;
  piVar29 = &iStack_3238;
  pcVar11 = "Got parse error at";
  do {
    apcStack_3388[0] = (code *)0x132dd8;
    cVar1 = bson_init_from_json(piVar15,pcVar8,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') goto LAB_00132ecf;
    if (iStack_3238 != 1) goto LAB_00132ee6;
    if (iStack_3234 != 1) goto LAB_00132ed9;
    apcStack_3388[0] = (code *)0x132e0b;
    pcVar8 = strstr((char *)piVar21,"Got parse error at");
    if (pcVar8 == (char *)0x0) goto LAB_00132ede;
    pcVar8 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
  } while (pcVar8 != (char *)0x0);
  pcVar8 = "{ \"d\": In";
  ppuVar28 = &PTR_anon_var_dwarf_1b1e6_00161448;
  piVar21 = aiStack_3230;
  piVar15 = aiStack_3300;
  piVar29 = &iStack_3238;
  pcVar11 = "Incomplete JSON";
  while( true ) {
    apcStack_3388[0] = (code *)0x132e60;
    cVar1 = bson_init_from_json(piVar15,pcVar8,0xffffffffffffffff,piVar29);
    if (cVar1 != '\0') break;
    if (iStack_3238 != 1) goto LAB_00132ef8;
    if (iStack_3234 != 1) goto LAB_00132eeb;
    apcStack_3388[0] = (code *)0x132e8b;
    pcVar8 = strstr((char *)piVar21,"Incomplete JSON");
    if (pcVar8 == (char *)0x0) goto LAB_00132ef0;
    pcVar8 = *ppuVar28;
    ppuVar28 = ppuVar28 + 1;
    if (pcVar8 == (char *)0x0) {
      return;
    }
  }
LAB_00132ed4:
  apcStack_3388[0] = (code *)0x132ed9;
  test_bson_json_infinity_cold_13();
LAB_00132ed9:
  apcStack_3388[0] = (code *)0x132ede;
  test_bson_json_infinity_cold_9();
LAB_00132ede:
  apcStack_3388[0] = (code *)0x132ee6;
  test_bson_json_infinity_cold_14();
LAB_00132ee6:
  apcStack_3388[0] = (code *)0x132eeb;
  test_bson_json_infinity_cold_8();
LAB_00132eeb:
  apcStack_3388[0] = (code *)0x132ef0;
  test_bson_json_infinity_cold_11();
LAB_00132ef0:
  apcStack_3388[0] = (code *)0x132ef8;
  test_bson_json_infinity_cold_12();
LAB_00132ef8:
  apcStack_3388[0] = test_bson_json_null;
  test_bson_json_infinity_cold_10();
  pcStack_3708 = (code *)0x132f2a;
  apcStack_3388[0] = (code *)apcStack_2f88;
  cVar1 = bson_init_from_json(auStack_3700,"{ \"x\": null }",0xffffffffffffffff,auStack_3610);
  if (cVar1 == '\0') {
    pcStack_3708 = (code *)0x132f65;
    test_bson_json_null_cold_1();
  }
  else {
    pcStack_3708 = (code *)0x132f33;
    uVar6 = bson_bcone_magic();
    pcStack_3708 = (code *)0x132f4f;
    cVar1 = bcon_extract(auStack_3700,"x",uVar6,9,0);
    if (cVar1 != '\0') {
      pcStack_3708 = (code *)0x132f5b;
      bson_destroy(auStack_3700);
      return;
    }
  }
  pcStack_3708 = test_bson_json_empty_final_object;
  test_bson_json_null_cold_2();
  pcStack_3b08 = (code *)0x0;
  pcStack_3b10 = "}";
  acStack_3b20[8] = -0x52;
  acStack_3b20[9] = '/';
  acStack_3b20[10] = '\x13';
  acStack_3b20[0xb] = '\0';
  acStack_3b20[0xc] = '\0';
  acStack_3b20[0xd] = '\0';
  acStack_3b20[0xe] = '\0';
  acStack_3b20[0xf] = '\0';
  piStack_3730 = piVar21;
  pdStack_3728 = (double *)pcVar11;
  ppuStack_3720 = ppuVar28;
  piStack_3718 = piVar15;
  piStack_3710 = piVar29;
  pcStack_3708 = (code *)apcStack_3388;
  uVar20 = bcon_new(0,"a","{","b","{");
  uStack_3a10 = 0;
  uStack_3a08 = 0;
  uStack_3a20 = 0;
  uStack_3a18 = 0;
  uStack_3a30 = 0;
  uStack_3a28 = 0;
  uStack_3a40 = 0;
  uStack_3a38 = 0;
  uStack_3a50 = 0;
  uStack_3a48 = 0;
  uStack_3a60 = 0;
  uStack_3a58 = 0;
  uStack_3a70 = 0;
  uStack_3a68 = 0;
  uStack_3a80 = (undefined *)0x500000003;
  uStack_3a78 = 5;
  pcStack_3b08 = (code *)0x13300b;
  cVar1 = bson_init_from_json(&uStack_3a80,"{\"a\": {\"b\": {}}}",0xffffffffffffffff,auStack_39b8);
  if (cVar1 != '\0') {
    pcStack_3b08 = (code *)0x133023;
    piVar29 = (int *)bson_get_data(&uStack_3a80);
    pcStack_3b08 = (code *)0x13302e;
    piVar15 = (int *)bson_get_data(uVar20);
    if (*(int *)(uVar20 + 4) == uStack_3a80._4_4_) {
      pcStack_3b08 = (code *)0x133043;
      pvVar9 = (void *)bson_get_data(uVar20);
      pcStack_3b08 = (code *)0x133053;
      pvVar10 = (void *)bson_get_data(&uStack_3a80);
      pcStack_3b08 = (code *)0x133061;
      iVar2 = bcmp(pvVar9,pvVar10,(ulong)*(uint *)(uVar20 + 4));
      if (iVar2 == 0) {
        pcStack_3b08 = (code *)0x133072;
        bson_destroy(&uStack_3a80);
        pcStack_3b08 = (code *)0x13307a;
        bson_destroy(uVar20);
        return;
      }
    }
    ppuVar28 = (undefined **)&uStack_3a80;
    pcStack_3b08 = (code *)0x13309b;
    uVar6 = bson_as_canonical_extended_json(ppuVar28);
    pcStack_3b08 = (code *)0x1330a8;
    uVar7 = bson_as_canonical_extended_json(uVar20);
    uVar22 = 0xffffffff;
    if (uStack_3a80._4_4_ != 0) {
      uVar24 = 0;
      do {
        if (*(int *)(uVar20 + 4) == (int)uVar24) break;
        if (*(char *)((long)piVar29 + uVar24) != *(char *)((long)piVar15 + uVar24)) {
          uVar22 = uVar24 & 0xffffffff;
          break;
        }
        uVar24 = uVar24 + 1;
      } while (uStack_3a80._4_4_ != (uint)uVar24);
    }
    if ((int)uVar22 == -1) {
      uVar3 = uStack_3a80._4_4_;
      if (uStack_3a80._4_4_ < *(uint *)(uVar20 + 4)) {
        uVar3 = *(uint *)(uVar20 + 4);
      }
      uVar22 = (ulong)(uVar3 - 1);
    }
    pcStack_3b08 = (code *)0x133103;
    fprintf(_stderr,"bson objects unequal (byte %u):\n(%s)\n(%s)\n",uVar22,uVar6,uVar7);
    pcStack_3b08 = (code *)0x13311b;
    uVar3 = open("failure.bad.bson",0x42,0x1a0);
    pcVar11 = (char *)(ulong)uVar3;
    pcStack_3b08 = (code *)0x133136;
    uVar4 = open("failure.expected.bson",0x42,0x1a0);
    uStack_3a84 = uVar3;
    if (uVar3 == 0xffffffff) {
LAB_00133187:
      pcStack_3b08 = (code *)0x13318c;
      test_bson_json_empty_final_object_cold_6();
LAB_0013318c:
      pcStack_3b08 = (code *)0x133191;
      test_bson_json_empty_final_object_cold_5();
LAB_00133191:
      pcStack_3b08 = (code *)0x133196;
      test_bson_json_empty_final_object_cold_2();
    }
    else {
      ppuVar28 = (undefined **)(ulong)uVar4;
      if (uVar4 == 0xffffffff) goto LAB_0013318c;
      pcVar11 = (char *)((ulong)uStack_3a80 >> 0x20);
      pcStack_3b08 = (code *)0x133160;
      pdVar16 = (double *)write(uVar3,piVar29,(size_t)pcVar11);
      if (pdVar16 != (double *)pcVar11) goto LAB_00133191;
      uVar20 = (ulong)*(uint *)(uVar20 + 4);
      pcStack_3b08 = (code *)0x133176;
      uVar22 = write(uVar4,piVar15,uVar20);
      if (uVar22 == uVar20) {
        pcStack_3b08 = (code *)0x133187;
        test_bson_json_empty_final_object_cold_4();
        goto LAB_00133187;
      }
    }
    pcStack_3b08 = (code *)0x13319b;
    test_bson_json_empty_final_object_cold_3();
  }
  pcStack_3b08 = test_bson_as_json_decimal128;
  test_bson_json_empty_final_object_cold_1();
  pcVar8 = acStack_3b20;
  acStack_3b20[8] = '\0';
  acStack_3b20[9] = '\0';
  acStack_3b20[10] = '\0';
  acStack_3b20[0xb] = '\0';
  acStack_3b20[0xc] = '\0';
  acStack_3b20[0xd] = '\0';
  acStack_3b20[0xe] = '@';
  acStack_3b20[0xf] = '0';
  acStack_3b20[0] = '\v';
  acStack_3b20[1] = '\0';
  acStack_3b20[2] = '\0';
  acStack_3b20[3] = '\0';
  acStack_3b20[4] = '\0';
  acStack_3b20[5] = '\0';
  acStack_3b20[6] = '\0';
  acStack_3b20[7] = '\0';
  pcStack_3b30 = (code *)0x1331ce;
  pcStack_3b10 = (char *)uVar20;
  pcStack_3b08 = (code *)piVar15;
  plVar17 = (long *)bson_new();
  pcStack_3b30 = (code *)0x1331e8;
  cVar1 = bson_append_decimal128(plVar17,"decimal128",0xffffffff,pcVar8);
  if (cVar1 == '\0') {
    pcStack_3b30 = (code *)0x133236;
    test_bson_as_json_decimal128_cold_1();
  }
  else {
    pcStack_3b30 = (code *)0x1331f7;
    pcVar8 = (char *)bson_as_json(plVar17,auStack_3b28);
    if (pcVar8 == "{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }") {
LAB_00133219:
      pcStack_3b30 = (code *)0x133221;
      bson_free(pcVar8);
      pcStack_3b30 = (code *)0x133229;
      bson_destroy(plVar17);
      return;
    }
    pcStack_3b30 = (code *)0x133215;
    iVar2 = strcmp(pcVar8,"{ \"decimal128\" : { \"$numberDecimal\" : \"11\" } }");
    if (iVar2 == 0) goto LAB_00133219;
  }
  pcStack_3b30 = test_bson_json_number_decimal;
  test_bson_as_json_decimal128_cold_2();
  ppcVar31 = &pcStack_3b30;
  pcStack_3f88 = (code *)0x133271;
  plStack_3b38 = plVar17;
  pcStack_3b30 = (code *)&pcStack_3708;
  cVar1 = bson_init_from_json(auStack_3e80,"{ \"key\" : { \"$numberDecimal\": \"11\" }}",
                              0xffffffffffffffff,auStack_3d98);
  if (cVar1 == '\0') goto LAB_00133315;
  pcStack_3f88 = (code *)0x13328e;
  cVar1 = bson_iter_init(auStack_3f00,auStack_3e80);
  if (cVar1 == '\0') {
    pcStack_3f88 = (code *)0x133301;
    test_bson_json_number_decimal_cold_2();
LAB_00133301:
    pcStack_3f88 = (code *)0x133306;
    test_bson_json_number_decimal_cold_3();
LAB_00133306:
    pcStack_3f88 = (code *)0x13330b;
    test_bson_json_number_decimal_cold_4();
LAB_0013330b:
    pcStack_3f88 = (code *)0x133310;
    test_bson_json_number_decimal_cold_5();
  }
  else {
    pcStack_3f88 = (code *)0x1332a6;
    cVar1 = bson_iter_find(auStack_3f00,"key");
    if (cVar1 == '\0') goto LAB_00133301;
    pcStack_3f88 = (code *)0x1332b7;
    iVar2 = bson_iter_type(auStack_3f00);
    if (iVar2 != 0x13) goto LAB_00133306;
    plVar17 = &lStack_3f10;
    pcStack_3f88 = (code *)0x1332d1;
    bson_iter_decimal128(auStack_3f00,plVar17);
    if (lStack_3f10 != 0xb) goto LAB_0013330b;
    if (lStack_3f08 == 0x3040000000000000) {
      pcStack_3f88 = (code *)0x1332f5;
      bson_destroy(auStack_3e80);
      return;
    }
  }
  pcStack_3f88 = (code *)0x133315;
  test_bson_json_number_decimal_cold_6();
LAB_00133315:
  pcStack_3f88 = test_bson_json_errors;
  test_bson_json_number_decimal_cold_1();
  pcVar23 = "{\"x\": {\"$numberLong\": 1}}";
  ppuVar27 = &PTR_anon_var_dwarf_1b2e2_00161470;
  plStack_3fa0 = plVar17;
  pdStack_3f98 = (double *)pcVar11;
  pcStack_3f90 = pcVar8;
  pcStack_3f88 = (code *)piVar29;
  do {
    pcStack_41b0 = (code *)0x133357;
    lVar5 = bson_new_from_json(pcVar23,0xffffffffffffffff,&iStack_41a0);
    if (lVar5 != 0) {
      pcStack_41b0 = (code *)0x1333a4;
      test_bson_json_errors_cold_1();
LAB_001333a4:
      pcStack_41b0 = (code *)0x1333c2;
      fprintf(_stderr,"FAIL\n\nAssert Failure: \"%s\" does not contain \"%s\"\n",acStack_4198,
              piVar29);
      pcStack_41b0 = (code *)0x1333c7;
      abort();
    }
    if (iStack_41a0 != 1) {
LAB_001333cc:
      pcStack_41b0 = test_bson_integer_width;
      test_bson_json_errors_cold_2();
      pcStack_43c8 = (code *)0x1333f1;
      pcStack_41b8 = acStack_4198;
      pcStack_41b0 = (code *)&iStack_41a0;
      pcVar11 = (char *)bson_new_from_json("{\"v\":-1234567890123, \"x\":12345678901234}",0x28,
                                           auStack_43b8);
      pcStack_43c8 = (code *)0x1333fe;
      pcVar8 = (char *)bson_as_json(pcVar11,0);
      if (pcVar8 == "{ \"v\" : -1234567890123, \"x\" : 12345678901234 }") {
LAB_00133420:
        pcStack_43c8 = (code *)0x133428;
        bson_free(pcVar8);
        pcStack_43c8 = (code *)0x133430;
        bson_destroy(pcVar11);
        return;
      }
      pcStack_43c8 = (code *)0x13341c;
      iVar2 = strcmp(pcVar8,"{ \"v\" : -1234567890123, \"x\" : 12345678901234 }");
      if (iVar2 == 0) goto LAB_00133420;
      pcStack_43c8 = test_bson_json_null_in_str;
      test_bson_integer_width_cold_1();
      uStack_45d8 = 0x2200223a2261227b;
      uStack_45d0 = 0x7d;
      uStack_45dc = 0x227b;
      pcStack_43c8 = (code *)pcVar11;
      lVar5 = bson_new_from_json(&uStack_45d8,9,&iStack_45c8);
      if (lVar5 == 0) {
        if (iStack_45c8 != 1) goto LAB_001334fc;
        if (iStack_45c4 != 1) goto LAB_00133501;
        pcVar11 = acStack_45c0;
        pcVar23 = strstr(pcVar11,"Got parse error");
        if (pcVar23 == (char *)0x0) goto LAB_00133506;
        lVar5 = bson_new_from_json(&uStack_45dc,3,&iStack_45c8);
        if (lVar5 != 0) goto LAB_001334f7;
        if (iStack_45c8 != 1) goto LAB_0013350e;
        if (iStack_45c4 == 1) {
          pcVar23 = strstr(pcVar11,"Got parse error");
          if (pcVar23 != (char *)0x0) {
            return;
          }
          goto LAB_00133518;
        }
      }
      else {
        test_bson_json_null_in_str_cold_1();
LAB_001334f7:
        test_bson_json_null_in_str_cold_4();
LAB_001334fc:
        test_bson_json_null_in_str_cold_2();
LAB_00133501:
        test_bson_json_null_in_str_cold_3();
LAB_00133506:
        test_bson_json_null_in_str_cold_8();
LAB_0013350e:
        test_bson_json_null_in_str_cold_5();
      }
      test_bson_json_null_in_str_cold_6();
LAB_00133518:
      test_bson_json_null_in_str_cold_7();
      uVar6 = extraout_RAX;
      _test_json_produces_multiple("[],[{\'\'",1,0,0);
      _test_json_produces_multiple("{},[{\'\'",1,0,0);
      uVar7 = bson_bcon_magic();
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,0,uVar6,pcVar11,ppuVar27,ppuVar28,pcVar8,piVar29,ppcVar31);
      uVar18 = bcon_new(0,"b",uVar7,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1} {\'b\': 1}",0,uVar6,uVar18,0);
      uVar6 = bson_new();
      uVar18 = bson_new();
      uVar19 = bson_new();
      _test_json_produces_multiple("{}{}{}",0,uVar6,uVar18,uVar19,0);
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,"b",uVar7,0xf,1,0);
      _test_json_produces_multiple("{\'a\': 1}, {\'b\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("{},{},{\'a\': 1}",0,uVar6,0);
      uVar6 = bcon_new(0,"a",uVar7,0xf,1,0);
      _test_json_produces_multiple("[],{\'a\': 1}",0,uVar6,0);
      uVar6 = bson_new();
      _test_json_produces_multiple("[]",0,uVar6,0);
      uVar6 = bcon_new(0,"0","{","x",uVar7,0xf,0,"}",0);
      _test_json_produces_multiple("[{\'x\': 0}]",0,uVar6,0);
      _test_json_produces_multiple("[],[{\'a\': 1}]",1,0,0);
      return;
    }
    if (iStack_419c != 2) {
      pcStack_41b0 = (code *)0x1333cc;
      test_bson_json_errors_cold_3();
      goto LAB_001333cc;
    }
    piVar29 = (int *)ppuVar27[-1];
    pcStack_41b0 = (code *)0x13337e;
    pcVar11 = strstr(acStack_4198,(char *)piVar29);
    if (pcVar11 == (char *)0x0) goto LAB_001333a4;
    pcVar23 = *ppuVar27;
    ppuVar27 = ppuVar27 + 2;
    if (pcVar23 == (char *)0x0) {
      return;
    }
  } while( true );
LAB_00132bff:
  apcStack_2f88[0] = (code *)0x132c04;
  test_bson_json_nan_cold_11();
  goto LAB_00132c04;
LAB_00132ebb:
  apcStack_3388[0] = (code *)0x132ec0;
  test_bson_json_infinity_cold_4();
LAB_00132ec0:
  apcStack_3388[0] = (code *)0x132ec5;
  test_bson_json_infinity_cold_5();
LAB_00132ec5:
  apcStack_3388[0] = (code *)0x132eca;
  test_bson_json_infinity_cold_6();
LAB_00132eca:
  piVar15 = &iStack_3238;
  pcVar11 = (char *)&dStack_3308;
  piVar21 = aiStack_3300;
  piVar29 = (int *)0x14a6f6;
  apcStack_3388[0] = (code *)0x132ecf;
  test_bson_json_infinity_cold_7();
LAB_00132ecf:
  apcStack_3388[0] = (code *)0x132ed4;
  test_bson_json_infinity_cold_15();
  goto LAB_00132ed4;
}

Assistant:

static void
test_bson_json_number_long_zero (void)
{
   bson_error_t error;
   bson_iter_t iter;
   const char *json = "{ \"key\": { \"$numberLong\": \"0\" }}";
   bson_t b;
   bool r;

   r = bson_init_from_json (&b, json, -1, &error);
   if (!r)
      fprintf (stderr, "%s\n", error.message);
   BSON_ASSERT (r);
   BSON_ASSERT (bson_iter_init (&iter, &b));
   BSON_ASSERT (bson_iter_find (&iter, "key"));
   BSON_ASSERT (BSON_ITER_HOLDS_INT64 (&iter));
   BSON_ASSERT (bson_iter_int64 (&iter) == 0);
   bson_destroy (&b);
}